

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymer.cpp
# Opt level: O3

Ptr __thiscall MobileElementManager::GetAttached(MobileElementManager *this,int index)

{
  long lVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  long lVar3;
  range_error *this_00;
  int in_EDX;
  undefined4 in_register_00000034;
  Ptr PVar4;
  
  lVar1 = *(long *)(CONCAT44(in_register_00000034,index) + 0x28);
  if ((ulong)(long)in_EDX <
      (ulong)(*(long *)(CONCAT44(in_register_00000034,index) + 0x30) - lVar1 >> 5)) {
    lVar3 = (long)in_EDX * 0x20;
    _Var2._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar1 + 0x10 + lVar3);
    this->prop_sum_ = (double)_Var2._M_pi;
    lVar1 = *(long *)(lVar1 + 0x18 + lVar3);
    *(long *)&this->pol_count_ = lVar1;
    if (lVar1 != 0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(lVar1 + 8) = *(int *)(lVar1 + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)(lVar1 + 8) = *(int *)(lVar1 + 8) + 1;
      }
    }
    PVar4.super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi;
    PVar4.super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
    return (Ptr)PVar4.super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (range_error *)__cxa_allocate_exception(0x10);
  std::range_error::range_error(this_00,"Polymerase index out of range.");
  __cxa_throw(this_00,&std::range_error::typeinfo,std::range_error::~range_error);
}

Assistant:

Polymer::Ptr MobileElementManager::GetAttached(int index) {
  if (index >= polymerases_.size()) {
    throw std::range_error("Polymerase index out of range.");
  }
  return polymerases_[index].second;
}